

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,JoinRef *ref)

{
  idx_t *piVar1;
  ExtraTypeInfoType *column_name_00;
  JoinRefType *args;
  string *args_1;
  JoinRefType JVar2;
  byte bVar3;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var4;
  LogicalType *pLVar5;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar6;
  _Head_base<0UL,_duckdb::Binding_*,_false> context;
  CorrelatedColumnInfo *pCVar7;
  pointer pCVar8;
  long *plVar9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  pointer puVar11;
  size_type sVar12;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> _Var13;
  type binder_00;
  _func_int **pp_Var14;
  pointer puVar15;
  bool bVar16;
  pointer pBVar17;
  type parent_binder;
  pointer pBVar18;
  optional_ptr<duckdb::UsingColumnSet,_true> oVar19;
  iterator iVar20;
  reference pvVar21;
  reference pvVar22;
  reference pvVar23;
  type pUVar24;
  idx_t __val;
  type pBVar25;
  BinderException *pBVar26;
  CorrelatedColumnInfo *cor_col;
  pointer pCVar27;
  TableRef *in_RDX;
  BindContext *pBVar28;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *col;
  optional_ptr<duckdb::LogicalType,_true> oVar29;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar30;
  pointer *__ptr;
  element_type *peVar31;
  Binder *pBVar32;
  ExpressionBinder *pEVar33;
  size_type sVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *using_column;
  pointer pbVar35;
  BindContext *this_00;
  CorrelatedColumnInfo *info;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *__u;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  ulong __n;
  pointer pbVar36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  _Head_base<0UL,_duckdb::BoundJoinRef_*,_false> local_488;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding_ref;
  optional_ptr<duckdb::LogicalType,_true> local_478;
  ExpressionType local_469;
  type local_468;
  templated_unique_single_t set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extra_using_columns;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> left_using_bindings;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_408;
  BindContext *local_400;
  BindContext *local_3f8;
  size_type local_3f0;
  vector<duckdb::BindingAlias,_true> left_bindings;
  ExpressionBinder expr_binder;
  LateralBinder binder;
  vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true> right_using_bindings;
  unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_> local_298;
  ParsedExpression *local_290;
  string local_288;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  extra_conditions;
  vector<duckdb::BindingAlias,_true> right_bindings;
  BindContext local_1f0;
  BindContext local_110;
  
  args = (JoinRefType *)((long)&in_RDX[1].alias._M_string_length + 1);
  local_478.ptr = (LogicalType *)in_RDX;
  make_uniq<duckdb::BoundJoinRef,duckdb::JoinRefType&>((duckdb *)&local_488,args);
  binding_ref = (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)ref;
  CreateBinder((Binder *)&binder,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  shared_ptr<duckdb::Binder,_true>::operator=
            (&pBVar17->left_binder,(shared_ptr<duckdb::Binder,_true> *)&binder);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &binder.super_ExpressionBinder.target_type);
  CreateBinder((Binder *)&binder,
               (ClientContext *)
               binding_ref[2].
               super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
               super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
               super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl,
               (optional_ptr<duckdb::Binder,_true>)binding_ref,REGULAR_BINDER);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  shared_ptr<duckdb::Binder,_true>::operator=
            (&pBVar17->right_binder,(shared_ptr<duckdb::Binder,_true> *)&binder);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &binder.super_ExpressionBinder.target_type);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  local_468 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar17->left_binder);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  parent_binder = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar17->right_binder);
  sVar12 = (((TableRef *)((long)local_478.ptr + 0x68))->alias)._M_string_length;
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pBVar17->type = (JoinType)sVar12;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             ((long)local_478.ptr + 0x68));
  BindJoin((Binder *)&binder,local_468,(TableRef *)binding_ref);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pp_Var14 = binder.super_ExpressionBinder._vptr_ExpressionBinder;
  binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
  _Var4._M_head_impl =
       (pBVar17->left).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar17->left).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)pp_Var14;
  if (_Var4._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundTableRef + 8))();
    if (binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0) {
      (**(code **)(*binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
    }
  }
  bVar16 = *(bool *)&(((TableRef *)((long)local_478.ptr + 0x68))->column_name_alias).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pBVar17->delim_flipped = bVar16;
  LateralBinder::LateralBinder
            (&binder,local_468,
             (ClientContext *)
             binding_ref[2].super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>
             ._M_t.super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
             _M_t.super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
             super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             &((TableRef *)((long)local_478.ptr + 0x68))->type);
  BindJoin((Binder *)&expr_binder,parent_binder,(TableRef *)binding_ref);
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pp_Var14 = expr_binder._vptr_ExpressionBinder;
  expr_binder._vptr_ExpressionBinder = (_func_int **)0x0;
  _Var4._M_head_impl =
       (pBVar17->right).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar17->right).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)pp_Var14;
  if (_Var4._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_BoundTableRef + 8))();
    if (expr_binder._vptr_ExpressionBinder != (_func_int **)0x0) {
      (**(code **)(*expr_binder._vptr_ExpressionBinder + 8))();
    }
  }
  if ((element_type *)(((TableRef *)((long)local_478.ptr + 0x68))->query_location).index !=
      (((TableRef *)((long)local_478.ptr + 0x68))->external_dependency).internal.
      super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (*(char *)&(((TableRef *)((long)local_478.ptr + 0x68))->column_name_alias).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      ExpressionBinder::ExpressionBinder
                (&expr_binder,parent_binder,
                 (ClientContext *)
                 binding_ref[2].
                 super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
                 super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
                 super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                 super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl,false);
      pLVar5 = (LogicalType *)
               (((TableRef *)((long)local_478.ptr + 0x68))->external_dependency).internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (oVar29.ptr = (LogicalType *)
                        (((TableRef *)((long)local_478.ptr + 0x68))->query_location).index;
          oVar29.ptr != pLVar5; oVar29.ptr = (LogicalType *)&(oVar29.ptr)->type_info_) {
        pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                  ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                *)&local_488);
        ExpressionBinder::Bind
                  ((ExpressionBinder *)&right_bindings,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&expr_binder,oVar29,false);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar17->duplicate_eliminated_columns,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &right_bindings);
        if (right_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
            .super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((right_bindings.
                         super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                         super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                         ._M_impl.super__Vector_impl_data._M_start)->catalog)._M_dataplus._M_p + 8))
                    ();
        }
      }
    }
    else {
      ExpressionBinder::ExpressionBinder
                (&expr_binder,local_468,
                 (ClientContext *)
                 binding_ref[2].
                 super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
                 super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
                 super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                 super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl,false);
      pLVar5 = (LogicalType *)
               (((TableRef *)((long)local_478.ptr + 0x68))->external_dependency).internal.
               super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (oVar29.ptr = (LogicalType *)
                        (((TableRef *)((long)local_478.ptr + 0x68))->query_location).index;
          oVar29.ptr != pLVar5; oVar29.ptr = (LogicalType *)&(oVar29.ptr)->type_info_) {
        pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                  ::operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                                *)&local_488);
        ExpressionBinder::Bind
                  ((ExpressionBinder *)&right_bindings,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&expr_binder,oVar29,false);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar17->duplicate_eliminated_columns,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &right_bindings);
        if (right_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
            .super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((right_bindings.
                         super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                         super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                         ._M_impl.super__Vector_impl_data._M_start)->catalog)._M_dataplus._M_p + 8))
                    ();
        }
      }
    }
    ExpressionBinder::~ExpressionBinder(&expr_binder);
  }
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
  operator=(&(pBVar17->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ,&(parent_binder->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           );
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pCVar27 = (pBVar17->correlated_columns).
            super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            .
            super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pCVar27 ==
        (pBVar17->correlated_columns).
        super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
        super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar16 = false;
      goto LAB_005fbfd3;
    }
    piVar1 = &pCVar27->depth;
    pCVar27 = pCVar27 + 1;
  } while (*piVar1 != 1);
  bVar16 = true;
LAB_005fbfd3:
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  pBVar17->lateral = bVar16;
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  if ((pBVar17->lateral == true) &&
     ((byte)((byte)(((TableRef *)((long)local_478.ptr + 0x68))->alias)._M_string_length | 2) != 3))
  {
    pBVar26 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&expr_binder,
               "The combining JOIN type must be INNER or LEFT for a LATERAL reference",
               (allocator *)&right_bindings);
    BinderException::BinderException(pBVar26,(string *)&expr_binder);
    __cxa_throw(pBVar26,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LateralBinder::~LateralBinder(&binder);
  extra_conditions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extra_using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extra_conditions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extra_conditions.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extra_using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extra_using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  JVar2 = *args;
  if (JVar2 == REGULAR) {
LAB_005fc04d:
    if ((((TableRef *)((long)local_478.ptr + 0x68))->alias).field_2._M_allocated_capacity !=
        *(size_type *)((long)&(((TableRef *)((long)local_478.ptr + 0x68))->alias).field_2 + 8)) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&extra_using_columns,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(((TableRef *)((long)local_478.ptr + 0x68))->alias).field_2);
    }
  }
  else if (JVar2 == NATURAL) {
    expr_binder._vptr_ExpressionBinder = (_func_int **)&expr_binder.stack_depth;
    expr_binder.target_type.id_ = SQLNULL;
    expr_binder.target_type.physical_type_ = ~INVALID;
    expr_binder.target_type._2_6_ = 0;
    expr_binder.target_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    expr_binder.target_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    expr_binder.macro_binding.ptr._0_4_ = 0x3f800000;
    expr_binder.lambda_bindings.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
    expr_binder.stack_depth = 0;
    puVar6 = (local_468->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar30 = (local_468->bind_context).bindings_list.
                   super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6;
        puVar30 = puVar30 + 1) {
      pBVar18 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                          (puVar30);
      pbVar35 = (pBVar18->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar36 = (pBVar18->names).
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar36 != pbVar35;
          pbVar36 = pbVar36 + 1) {
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&expr_binder,pbVar36);
      }
    }
    for (peVar31 = expr_binder.target_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar31 != (element_type *)0x0; peVar31 = (element_type *)peVar31->_vptr_ExtraTypeInfo) {
      column_name_00 = &peVar31->type;
      oVar19 = BindContext::GetUsingBinding(&parent_binder->bind_context,(string *)column_name_00);
      BindingAlias::BindingAlias((BindingAlias *)&binder);
      if (oVar19.ptr == (UsingColumnSet *)0x0) {
        ::std::__cxx11::string::string
                  ((string *)&right_bindings,"right",(allocator *)&left_bindings);
        bVar16 = TryFindBinding(parent_binder,(string *)column_name_00,(string *)&right_bindings,
                                (BindingAlias *)&binder);
        ::std::__cxx11::string::~string((string *)&right_bindings);
        if (bVar16) goto LAB_005fc178;
      }
      else {
LAB_005fc178:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extra_using_columns,(value_type *)column_name_00);
      }
      BindingAlias::~BindingAlias((BindingAlias *)&binder);
    }
    if (extra_using_columns.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        extra_using_columns.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::string
                ((string *)&binder,"No columns found to join on in NATURAL JOIN.\n",
                 (allocator *)&right_bindings);
      ::std::__cxx11::string::append((char *)&binder);
      right_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&right_bindings.
                     super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                     super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      right_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      right_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      left_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&left_bindings.
                     super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                     super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      left_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      left_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      puVar30 = (local_468->bind_context).bindings_list.
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (binding_ref = (local_468->bind_context).bindings_list.
                         super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; binding_ref != puVar30;
          binding_ref = binding_ref + 1) {
        pBVar25 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                            (binding_ref);
        pbVar35 = (pBVar25->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar36 = (pBVar25->names).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar36 != pbVar35;
            pbVar36 = pbVar36 + 1) {
          if (right_bindings.
              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
              super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            ::std::__cxx11::string::append((char *)&right_bindings);
          }
          Binding::GetAlias_abi_cxx11_(&local_288,pBVar25);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &right_using_bindings,&local_288,".");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &left_using_bindings,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &right_using_bindings,pbVar36);
          ::std::__cxx11::string::append((string *)&right_bindings);
          ::std::__cxx11::string::~string((string *)&left_using_bindings);
          ::std::__cxx11::string::~string((string *)&right_using_bindings);
          ::std::__cxx11::string::~string((string *)&local_288);
        }
      }
      puVar11 = (parent_binder->bind_context).bindings_list.
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (binding_ref = (parent_binder->bind_context).bindings_list.
                         super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; binding_ref != puVar11;
          binding_ref = binding_ref + 1) {
        pBVar25 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                            (binding_ref);
        pbVar35 = (pBVar25->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar36 = (pBVar25->names).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar36 != pbVar35;
            pbVar36 = pbVar36 + 1) {
          if (left_bindings.
              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
              super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
              _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            ::std::__cxx11::string::append((char *)&left_bindings);
          }
          Binding::GetAlias_abi_cxx11_(&local_288,pBVar25);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &right_using_bindings,&local_288,".");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &left_using_bindings,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &right_using_bindings,pbVar36);
          ::std::__cxx11::string::append((string *)&left_bindings);
          ::std::__cxx11::string::~string((string *)&left_using_bindings);
          ::std::__cxx11::string::~string((string *)&right_using_bindings);
          ::std::__cxx11::string::~string((string *)&local_288);
        }
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &left_using_bindings,"\n   Left candidates: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &right_bindings);
      ::std::__cxx11::string::append((string *)&binder);
      ::std::__cxx11::string::~string((string *)&left_using_bindings);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &left_using_bindings,"\n   Right candidates: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &left_bindings);
      ::std::__cxx11::string::append((string *)&binder);
      ::std::__cxx11::string::~string((string *)&left_using_bindings);
      pBVar26 = (BinderException *)__cxa_allocate_exception(0x10);
      BinderException::BinderException<>(pBVar26,(TableRef *)local_478.ptr,(string *)&binder);
      __cxa_throw(pBVar26,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&expr_binder);
  }
  else if (JVar2 == ASOF) goto LAB_005fc04d;
  pbVar36 = extra_using_columns.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  expr_binder._vptr_ExpressionBinder = (_func_int **)0x0;
  expr_binder.target_type.id_ = INVALID;
  expr_binder.target_type.physical_type_ = ~INVALID;
  expr_binder.target_type._2_6_ = 0;
  expr_binder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  binder.super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&binder.super_ExpressionBinder.stack_depth;
  binder.super_ExpressionBinder.target_type.id_ = SQLNULL;
  binder.super_ExpressionBinder.target_type.physical_type_ = ~INVALID;
  binder.super_ExpressionBinder.target_type._2_6_ = 0;
  binder.super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  binder.super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  binder.super_ExpressionBinder.macro_binding.ptr._0_4_ = 0x3f800000;
  binder.super_ExpressionBinder.lambda_bindings.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
  binder.super_ExpressionBinder.stack_depth = 0;
  for (pbVar35 = extra_using_columns.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar35 != pbVar36;
      pbVar35 = pbVar35 + 1) {
    iVar20 = ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&binder,pbVar35);
    if (iVar20.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      ::std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&binder,pbVar35);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expr_binder,pbVar35);
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&binder);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&extra_using_columns,&expr_binder);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&expr_binder);
  if (extra_using_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      extra_using_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    left_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    left_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    left_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    right_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    right_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    right_using_bindings.
    super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    .
    super__Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3f8 = &local_468->bind_context;
    local_400 = &parent_binder->bind_context;
    for (__n = 0; __n < (ulong)((long)extra_using_columns.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)extra_using_columns.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1
        ) {
      pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&extra_using_columns,__n);
      binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)BindContext::GetUsingBinding(local_3f8,pvVar21);
      expr_binder._vptr_ExpressionBinder =
           (_func_int **)BindContext::GetUsingBinding(local_400,pvVar21);
      if (binder.super_ExpressionBinder._vptr_ExpressionBinder == (_func_int **)0x0) {
        BindContext::GetMatchingBinding(local_3f8,pvVar21);
      }
      if (expr_binder._vptr_ExpressionBinder == (_func_int **)0x0) {
        BindContext::GetMatchingBinding(local_400,pvVar21);
      }
      ::std::
      vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
      ::push_back(&left_using_bindings.
                   super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
                  ,(value_type *)&binder);
      ::std::
      vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
      ::push_back(&right_using_bindings.
                   super_vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
                  ,(value_type *)&expr_binder);
    }
    pBVar28 = (BindContext *)(binding_ref + 0x11);
    sVar34 = 0;
    while (sVar34 < (ulong)((long)extra_using_columns.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)extra_using_columns.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      local_3f0 = sVar34;
      pvVar21 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&extra_using_columns,sVar34);
      BindingAlias::BindingAlias((BindingAlias *)&expr_binder);
      BindingAlias::BindingAlias((BindingAlias *)&right_bindings);
      make_uniq<duckdb::UsingColumnSet>();
      sVar34 = local_3f0;
      pvVar22 = vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::get<true>
                          (&left_using_bindings,local_3f0);
      pvVar23 = vector<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_true>::get<true>
                          (&right_using_bindings,sVar34);
      oVar19.ptr = pvVar22->ptr;
      pBVar32 = (Binder *)0x106c7e7;
      ::std::__cxx11::string::string((string *)&left_bindings,"left",(allocator *)&local_288);
      RetrieveUsingBinding
                ((BindingAlias *)&binder,pBVar32,local_468,oVar19,pvVar21,(string *)&left_bindings);
      BindingAlias::operator=((BindingAlias *)&expr_binder,(BindingAlias *)&binder);
      BindingAlias::~BindingAlias((BindingAlias *)&binder);
      ::std::__cxx11::string::~string((string *)&left_bindings);
      oVar19.ptr = pvVar23->ptr;
      pBVar32 = (Binder *)0x106c8e4;
      ::std::__cxx11::string::string((string *)&left_bindings,"right",(allocator *)&local_288);
      RetrieveUsingBinding
                ((BindingAlias *)&binder,pBVar32,parent_binder,oVar19,pvVar21,
                 (string *)&left_bindings);
      BindingAlias::operator=((BindingAlias *)&right_bindings,(BindingAlias *)&binder);
      BindingAlias::~BindingAlias((BindingAlias *)&binder);
      ::std::__cxx11::string::~string((string *)&left_bindings);
      binder_00 = local_468;
      local_469 = COMPARE_BOUNDARY_START;
      if (*args == ASOF) {
        local_469 = (local_3f0 ==
                    ((long)extra_using_columns.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)extra_using_columns.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) * '\x05' +
                    COMPARE_BOUNDARY_START;
      }
      context._M_head_impl =
           binding_ref[2].super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
           _M_t.super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
           super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
      ExpressionBinder::ExpressionBinder
                (&binder.super_ExpressionBinder,local_468,(ClientContext *)context._M_head_impl,
                 false);
      BindColumn((duckdb *)&left_bindings,binder_00,(ClientContext *)context._M_head_impl,
                 (BindingAlias *)&expr_binder,pvVar21);
      BindColumn((duckdb *)&local_288,parent_binder,(ClientContext *)context._M_head_impl,
                 (BindingAlias *)&right_bindings,pvVar21);
      make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&local_290,&local_469,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&left_bindings,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_288);
      local_408._M_head_impl = local_290;
      if ((_Hash_node_base *)local_288._M_dataplus._M_p != (_Hash_node_base *)0x0) {
        (**(code **)&((((unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_> *)
                       local_288._M_dataplus._M_p)->_M_t).
                      super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>
                      .super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl)->binding_type)
                  ();
      }
      if (left_bindings.super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
          super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((left_bindings.
                       super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                       super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                       ._M_impl.super__Vector_impl_data._M_start)->catalog)._M_dataplus._M_p + 8))()
        ;
      }
      ExpressionBinder::~ExpressionBinder(&binder.super_ExpressionBinder);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&extra_conditions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_408);
      if (local_408._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)&((((__uniq_ptr_data<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true,_true>
                         *)&((local_408._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                      super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>
                      .super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl)->binding_type)
                  ();
      }
      pUVar24 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                ::operator*(&set);
      AddUsingBindings(pUVar24,pvVar22->ptr,(BindingAlias *)&expr_binder);
      pUVar24 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                ::operator*(&set);
      AddUsingBindings(pUVar24,pvVar23->ptr,(BindingAlias *)&right_bindings);
      pUVar24 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                ::operator*(&set);
      bVar3 = (byte)(((TableRef *)((long)local_478.ptr + 0x68))->alias)._M_string_length;
      if (bVar3 < 0xb) {
        pEVar33 = &expr_binder;
        if ((0x6aU >> (bVar3 & 0x1f) & 1) == 0) {
          if ((0x604U >> (bVar3 & 0x1f) & 1) == 0) goto LAB_005fc64b;
          pEVar33 = (ExpressionBinder *)&right_bindings;
        }
        BindingAlias::operator=(&pUVar24->primary_binding,(BindingAlias *)pEVar33);
      }
LAB_005fc64b:
      oVar19.ptr = pvVar22->ptr;
      pUVar24 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                ::operator*(&set);
      BindContext::TransferUsingBinding(pBVar28,local_3f8,oVar19,pUVar24,pvVar21);
      oVar19.ptr = pvVar23->ptr;
      pUVar24 = unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                ::operator*(&set);
      BindContext::TransferUsingBinding(pBVar28,local_400,oVar19,pUVar24,pvVar21);
      local_298._M_t.
      super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
      .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true,_true>
            )(__uniq_ptr_data<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true,_true>
              )set.
               super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
               .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl;
      set.super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::UsingColumnSet_*,_std::default_delete<duckdb::UsingColumnSet>_>
      .super__Head_base<0UL,_duckdb::UsingColumnSet_*,_false>._M_head_impl =
           (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>)
           (__uniq_ptr_data<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true,_true>
            )0x0;
      AddUsingBindingSet((Binder *)binding_ref,
                         (unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>
                          *)&local_298);
      ::std::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>::
      ~unique_ptr(&local_298);
      ::std::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>::
      ~unique_ptr(&set.
                   super_unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>_>
                 );
      BindingAlias::~BindingAlias((BindingAlias *)&right_bindings);
      BindingAlias::~BindingAlias((BindingAlias *)&expr_binder);
      sVar34 = local_3f0 + 1;
    }
    ::std::
    _Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ::~_Vector_base((_Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
                     *)&right_using_bindings);
    ::std::
    _Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
    ::~_Vector_base((_Vector_base<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>,_std::allocator<duckdb::optional_ptr<duckdb::UsingColumnSet,_true>_>_>
                     *)&left_using_bindings);
  }
  BindContext::GetBindingAliases(&right_bindings,&parent_binder->bind_context);
  this_00 = &local_468->bind_context;
  BindContext::GetBindingAliases(&left_bindings,this_00);
  pBVar28 = (BindContext *)(binding_ref + 0x11);
  BindContext::BindContext(&local_110,this_00);
  BindContext::AddContext(pBVar28,&local_110);
  BindContext::~BindContext(&local_110);
  BindContext::BindContext(&local_1f0,&parent_binder->bind_context);
  BindContext::AddContext(pBVar28,&local_1f0);
  BindContext::~BindContext(&local_1f0);
  pCVar7 = (local_468->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (info = (local_468->correlated_columns).
              super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              .
              super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; info != pCVar7; info = info + 1) {
    if (info->depth != 0) {
      AddCorrelatedColumn((Binder *)binding_ref,info);
    }
  }
  pCVar8 = (parent_binder->correlated_columns).
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar27 = (parent_binder->correlated_columns).
                 super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                 .
                 super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      puVar15 = extra_conditions.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish, pCVar27 != pCVar8; pCVar27 = pCVar27 + 1
      ) {
    CorrelatedColumnInfo::CorrelatedColumnInfo((CorrelatedColumnInfo *)&binder,pCVar27);
    if ((ExpressionBinder *)0x1 < binder.super_ExpressionBinder.stored_binder.ptr) {
      binder.super_ExpressionBinder.stored_binder.ptr =
           (ExpressionBinder *)
           ((long)&binder.super_ExpressionBinder.stored_binder.ptr[-1].bound_columns.
                   super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                   .
                   super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      AddCorrelatedColumn((Binder *)binding_ref,(CorrelatedColumnInfo *)&binder);
    }
    CorrelatedColumnInfo::~CorrelatedColumnInfo((CorrelatedColumnInfo *)&binder);
  }
  args_1 = &((TableRef *)((long)local_478.ptr + 0x68))->alias;
  local_478.ptr = (LogicalType *)args_1;
  for (__u = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              *)extra_conditions.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __u != (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              *)puVar15; __u = __u + 1) {
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )*(tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> *)
           local_478.ptr ==
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      ::std::
      __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
      operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)local_478.ptr,__u);
    }
    else {
      expr_binder._vptr_ExpressionBinder =
           (_func_int **)CONCAT71(expr_binder._vptr_ExpressionBinder._1_7_,0x32);
      make_uniq<duckdb::ConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&binder,(ExpressionType *)&expr_binder,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)args_1,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)__u);
      pp_Var14 = binder.super_ExpressionBinder._vptr_ExpressionBinder;
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
      plVar9 = (long *)(args_1->_M_dataplus)._M_p;
      (args_1->_M_dataplus)._M_p = (pointer)pp_Var14;
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 8))();
        if (binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0) {
          (**(code **)(*binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
        }
      }
    }
  }
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      *(tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> *)
       local_478.ptr !=
      (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      0x0) {
    WhereBinder::WhereBinder
              ((WhereBinder *)&binder,(Binder *)binding_ref,
               (ClientContext *)
               binding_ref[2].
               super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
               super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
               super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
               super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl,
               (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
    ExpressionBinder::Bind
              (&expr_binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&binder,local_478,false);
    pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_488);
    pp_Var14 = expr_binder._vptr_ExpressionBinder;
    expr_binder._vptr_ExpressionBinder = (_func_int **)0x0;
    _Var10._M_head_impl =
         (pBVar17->condition).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar17->condition).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)pp_Var14;
    if (_Var10._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var10._M_head_impl)->super_BaseExpression + 8))();
      if (expr_binder._vptr_ExpressionBinder != (_func_int **)0x0) {
        (**(code **)(*expr_binder._vptr_ExpressionBinder + 8))();
      }
    }
    ExpressionBinder::~ExpressionBinder(&binder.super_ExpressionBinder);
  }
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  if (pBVar17->type == SEMI) {
LAB_005fc9b4:
    BindContext::RemoveContext(pBVar28,&right_bindings);
    pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_488);
    if (pBVar17->type == MARK) {
      __val = GenerateTableIndex((Binder *)binding_ref);
      ::std::__cxx11::to_string((string *)&expr_binder,__val);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binder,
                       "__internal_mark_join_ref",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &expr_binder);
      ::std::__cxx11::string::~string((string *)&expr_binder);
      ::std::__cxx11::string::string
                ((string *)&expr_binder,"__mark_index_column",(allocator *)&local_290);
      __l._M_len = 1;
      __l._M_array = (iterator)&expr_binder;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&left_using_bindings,__l,(allocator_type *)&set);
      LogicalType::LogicalType((LogicalType *)&local_288,BOOLEAN);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_288;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &right_using_bindings,__l_00,(allocator_type *)&local_408);
      BindContext::AddGenericBinding
                (pBVar28,__val,(string *)&binder,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&left_using_bindings,(vector<duckdb::LogicalType,_true> *)&right_using_bindings)
      ;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &right_using_bindings);
      LogicalType::~LogicalType((LogicalType *)&local_288);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&left_using_bindings);
      ::std::__cxx11::string::~string((string *)&expr_binder);
      pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
                operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                            *)&local_488);
      pBVar17->mark_index = __val;
      ::std::__cxx11::string::~string((string *)&binder);
    }
  }
  else {
    pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_488);
    if (pBVar17->type == ANTI) goto LAB_005fc9b4;
    pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_488);
    if (pBVar17->type == MARK) goto LAB_005fc9b4;
  }
  pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
            operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                        *)&local_488);
  if (pBVar17->type != RIGHT_SEMI) {
    pBVar17 = unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>::
              operator->((unique_ptr<duckdb::BoundJoinRef,_std::default_delete<duckdb::BoundJoinRef>,_true>
                          *)&local_488);
    if (pBVar17->type != RIGHT_ANTI) goto LAB_005fcb1b;
  }
  BindContext::RemoveContext(pBVar28,&left_bindings);
LAB_005fcb1b:
  _Var13._M_head_impl = local_488._M_head_impl;
  local_488._M_head_impl = (BoundJoinRef *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var13._M_head_impl;
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            (&left_bindings.
              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>);
  ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::~vector
            (&right_bindings.
              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&extra_using_columns);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&extra_conditions.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           );
  if (local_488._M_head_impl != (BoundJoinRef *)0x0) {
    (*((local_488._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
  }
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(JoinRef &ref) {
	auto result = make_uniq<BoundJoinRef>(ref.ref_type);
	result->left_binder = Binder::CreateBinder(context, this);
	result->right_binder = Binder::CreateBinder(context, this);
	auto &left_binder = *result->left_binder;
	auto &right_binder = *result->right_binder;

	result->type = ref.type;
	result->left = left_binder.BindJoin(*this, *ref.left);
	result->delim_flipped = ref.delim_flipped;

	{
		LateralBinder binder(left_binder, context);
		result->right = right_binder.BindJoin(*this, *ref.right);
		if (!ref.duplicate_eliminated_columns.empty()) {
			if (ref.delim_flipped) {
				// We gotta use the expression binder of the right side
				ExpressionBinder expr_binder(right_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			} else {
				// We use the left side
				ExpressionBinder expr_binder(left_binder, context);
				for (auto &col : ref.duplicate_eliminated_columns) {
					result->duplicate_eliminated_columns.emplace_back(expr_binder.Bind(col));
				}
			}
		}
		bool is_lateral = false;
		// Store the correlated columns in the right binder in bound ref for planning of LATERALs
		// Ignore the correlated columns in the left binder, flattening handles those correlations
		result->correlated_columns = right_binder.correlated_columns;
		// Find correlations for the current join
		for (auto &cor_col : result->correlated_columns) {
			if (cor_col.depth == 1) {
				// Depth 1 indicates columns binding from the left indicating a lateral join
				is_lateral = true;
				break;
			}
		}
		result->lateral = is_lateral;
		if (result->lateral) {
			// lateral join: can only be an INNER or LEFT join
			if (ref.type != JoinType::INNER && ref.type != JoinType::LEFT) {
				throw BinderException("The combining JOIN type must be INNER or LEFT for a LATERAL reference");
			}
		}
	}

	vector<unique_ptr<ParsedExpression>> extra_conditions;
	vector<string> extra_using_columns;
	switch (ref.ref_type) {
	case JoinRefType::NATURAL: {
		// natural join, figure out which column names are present in both sides of the join
		// first bind the left hand side and get a list of all the tables and column names
		case_insensitive_set_t lhs_columns;
		auto &lhs_binding_list = left_binder.bind_context.GetBindingsList();
		for (auto &binding : lhs_binding_list) {
			for (auto &column_name : binding->names) {
				lhs_columns.insert(column_name);
			}
		}
		// now bind the rhs
		for (auto &column_name : lhs_columns) {
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(column_name);

			BindingAlias right_binding;
			// loop over the set of lhs columns, and figure out if there is a table in the rhs with the same name
			if (!right_using_binding) {
				if (!right_binder.TryFindBinding(column_name, "right", right_binding)) {
					// no match found for this column on the rhs: skip
					continue;
				}
			}
			extra_using_columns.push_back(column_name);
		}
		if (extra_using_columns.empty()) {
			// no matching bindings found in natural join: throw an exception
			string error_msg = "No columns found to join on in NATURAL JOIN.\n";
			error_msg += "Use CROSS JOIN if you intended for this to be a cross-product.";
			// gather all left/right candidates
			string left_candidates, right_candidates;
			auto &rhs_binding_list = right_binder.bind_context.GetBindingsList();
			for (auto &binding_ref : lhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!left_candidates.empty()) {
						left_candidates += ", ";
					}
					left_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			for (auto &binding_ref : rhs_binding_list) {
				auto &binding = *binding_ref;
				for (auto &column_name : binding.names) {
					if (!right_candidates.empty()) {
						right_candidates += ", ";
					}
					right_candidates += binding.GetAlias() + "." + column_name;
				}
			}
			error_msg += "\n   Left candidates: " + left_candidates;
			error_msg += "\n   Right candidates: " + right_candidates;
			throw BinderException(ref, error_msg);
		}
		break;
	}
	case JoinRefType::REGULAR:
	case JoinRefType::ASOF:
		if (!ref.using_columns.empty()) {
			// USING columns
			D_ASSERT(!result->condition);
			extra_using_columns = ref.using_columns;
		}
		break;

	case JoinRefType::CROSS:
	case JoinRefType::POSITIONAL:
	case JoinRefType::DEPENDENT:
		break;
	}
	extra_using_columns = RemoveDuplicateUsingColumns(extra_using_columns);

	if (!extra_using_columns.empty()) {
		vector<optional_ptr<UsingColumnSet>> left_using_bindings;
		vector<optional_ptr<UsingColumnSet>> right_using_bindings;
		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			// we check if there is ALREADY a using column of the same name in the left and right set
			// this can happen if we chain USING clauses
			// e.g. x JOIN y USING (c) JOIN z USING (c)
			auto left_using_binding = left_binder.bind_context.GetUsingBinding(using_column);
			auto right_using_binding = right_binder.bind_context.GetUsingBinding(using_column);
			if (!left_using_binding) {
				left_binder.bind_context.GetMatchingBinding(using_column);
			}
			if (!right_using_binding) {
				right_binder.bind_context.GetMatchingBinding(using_column);
			}
			left_using_bindings.push_back(left_using_binding);
			right_using_bindings.push_back(right_using_binding);
		}

		for (idx_t i = 0; i < extra_using_columns.size(); i++) {
			auto &using_column = extra_using_columns[i];
			BindingAlias left_binding;
			BindingAlias right_binding;

			auto set = make_uniq<UsingColumnSet>();
			auto &left_using_binding = left_using_bindings[i];
			auto &right_using_binding = right_using_bindings[i];
			left_binding = RetrieveUsingBinding(left_binder, left_using_binding, using_column, "left");
			right_binding = RetrieveUsingBinding(right_binder, right_using_binding, using_column, "right");

			// Last column of ASOF JOIN ... USING is >=
			const auto type = (ref.ref_type == JoinRefType::ASOF && i == extra_using_columns.size() - 1)
			                      ? ExpressionType::COMPARE_GREATERTHANOREQUALTO
			                      : ExpressionType::COMPARE_EQUAL;

			extra_conditions.push_back(
			    AddCondition(context, left_binder, right_binder, left_binding, right_binding, using_column, type));

			AddUsingBindings(*set, left_using_binding, left_binding);
			AddUsingBindings(*set, right_using_binding, right_binding);
			SetPrimaryBinding(*set, ref.type, left_binding, right_binding);
			bind_context.TransferUsingBinding(left_binder.bind_context, left_using_binding, *set, using_column);
			bind_context.TransferUsingBinding(right_binder.bind_context, right_using_binding, *set, using_column);
			AddUsingBindingSet(std::move(set));
		}
	}

	auto right_bindings = right_binder.bind_context.GetBindingAliases();
	auto left_bindings = left_binder.bind_context.GetBindingAliases();

	bind_context.AddContext(std::move(left_binder.bind_context));
	bind_context.AddContext(std::move(right_binder.bind_context));

	// Update the correlated columns for the parent binder
	// For the left binder, depth >= 1 indicates correlations from the parent binder
	for (const auto &col : left_binder.correlated_columns) {
		if (col.depth >= 1) {
			AddCorrelatedColumn(col);
		}
	}
	// For the right binder, depth > 1 indicates correlations from the parent binder
	// (depth = 1 indicates correlations from the left side of the join)
	for (auto col : right_binder.correlated_columns) {
		if (col.depth > 1) {
			// Decrement the depth to account for the effect of the lateral binder
			col.depth--;
			AddCorrelatedColumn(col);
		}
	}

	for (auto &condition : extra_conditions) {
		if (ref.condition) {
			ref.condition = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(ref.condition),
			                                                 std::move(condition));
		} else {
			ref.condition = std::move(condition);
		}
	}
	if (ref.condition) {
		WhereBinder binder(*this, context);
		result->condition = binder.Bind(ref.condition);
	}

	if (result->type == JoinType::SEMI || result->type == JoinType::ANTI || result->type == JoinType::MARK) {
		bind_context.RemoveContext(right_bindings);
		if (result->type == JoinType::MARK) {
			auto mark_join_idx = GenerateTableIndex();
			string mark_join_alias = "__internal_mark_join_ref" + to_string(mark_join_idx);
			bind_context.AddGenericBinding(mark_join_idx, mark_join_alias, {"__mark_index_column"},
			                               {LogicalType::BOOLEAN});
			result->mark_index = mark_join_idx;
		}
	}
	if (result->type == JoinType::RIGHT_SEMI || result->type == JoinType::RIGHT_ANTI) {
		bind_context.RemoveContext(left_bindings);
	}

	return std::move(result);
}